

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_lsd.cpp
# Opt level: O3

void msd_lsd<6u>(Cacheblock<6U> *cache,size_t N,size_t depth)

{
  undefined8 *puVar1;
  int iVar2;
  size_t i;
  uchar *puVar3;
  void *__src;
  long lVar4;
  Cacheblock<6U> *pCVar5;
  long lVar6;
  long lVar7;
  size_t sVar8;
  Cacheblock<6U> *pCVar9;
  byte bVar10;
  byte bVar11;
  size_t sVar12;
  ulong N_00;
  uchar *puVar13;
  bool bVar14;
  long local_1038 [256];
  long local_838 [257];
  
  N_00 = N;
  if (N < 0x20) {
    pCVar5 = cache;
    if (N < 2) {
      return;
    }
  }
  else {
    do {
      fill_cache<6u>(cache,N_00,depth);
      puVar13 = (cache->chars)._M_elems + 5;
      lVar7 = 5;
      do {
        memset(local_1038 + 0x100,0,0x800);
        puVar3 = puVar13;
        sVar12 = N_00;
        do {
          local_1038[(ulong)*puVar3 + 0x100] = local_1038[(ulong)*puVar3 + 0x100] + 1;
          puVar3 = puVar3 + 0x10;
          sVar12 = sVar12 - 1;
        } while (sVar12 != 0);
        __src = malloc(N_00 << 4);
        local_1038[0] = 0;
        lVar4 = 1;
        lVar6 = 0;
        do {
          lVar6 = lVar6 + local_1038[lVar4 + 0xff];
          local_1038[lVar4] = lVar6;
          lVar4 = lVar4 + 1;
          pCVar5 = cache;
          sVar12 = N_00;
        } while (lVar4 != 0x100);
        do {
          bVar10 = (pCVar5->chars)._M_elems[lVar7];
          lVar4 = local_1038[bVar10];
          local_1038[bVar10] = lVar4 + 1;
          puVar3 = pCVar5->ptr;
          puVar1 = (undefined8 *)((long)__src + lVar4 * 0x10);
          *puVar1 = *(undefined8 *)pCVar5;
          puVar1[1] = puVar3;
          sVar12 = sVar12 - 1;
          pCVar5 = pCVar5 + 1;
        } while (sVar12 != 0);
        memcpy(cache,__src,N_00 << 4);
        free(__src);
        puVar13 = puVar13 + -1;
        bVar14 = lVar7 != 0;
        lVar7 = lVar7 + -1;
      } while (bVar14);
      if (N_00 == 1) {
        return;
      }
      depth = depth + 6;
      sVar8 = 1;
      N = 1;
      sVar12 = 0;
      pCVar5 = cache;
      do {
        if (*(short *)((pCVar5->chars)._M_elems + 4) == *(short *)(pCVar5[1].chars._M_elems + 4) &&
            *(int *)(pCVar5->chars)._M_elems == *(int *)pCVar5[1].chars._M_elems) {
          N = N + 1;
        }
        else {
          if ((1 < N) && (cache[sVar12].chars._M_elems[5] != '\0')) {
            msd_lsd<6u>(cache + sVar12,N,depth);
          }
          N = 1;
          sVar12 = sVar8;
        }
        sVar8 = sVar8 + 1;
        pCVar5 = pCVar5 + 1;
      } while (N_00 != sVar8);
      if (N < 2) {
        return;
      }
      if (cache[sVar12].chars._M_elems[5] == '\0') {
        return;
      }
      cache = cache + sVar12;
      N_00 = N;
      pCVar5 = cache;
    } while (0x1f < N);
  }
  do {
    puVar13 = cache[1].ptr;
    cache = cache + 1;
    for (pCVar9 = cache; pCVar5 < pCVar9; pCVar9 = pCVar9 + -1) {
      puVar3 = pCVar9[-1].ptr;
      bVar10 = puVar3[depth];
      bVar11 = puVar13[depth];
      if ((bVar10 != 0) && (sVar12 = depth, bVar10 == bVar11)) {
        do {
          sVar12 = sVar12 + 1;
          bVar10 = puVar3[sVar12];
          bVar11 = puVar13[sVar12];
          if (bVar10 == 0) break;
        } while (bVar10 == bVar11);
      }
      if (bVar10 <= bVar11) break;
      pCVar9->ptr = puVar3;
    }
    iVar2 = (int)N;
    pCVar9->ptr = puVar13;
    N = (size_t)(iVar2 - 1);
    if (iVar2 < 3) {
      return;
    }
  } while( true );
}

Assistant:

static void
msd_lsd(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	static_assert(CachedChars>=1, "CachedChars must be positive");
	if (N < 32) {
		insertion_sort(cache, N, depth);
		return;
	}
	fill_cache(cache, N, depth);
	for (int byte=CachedChars-1; byte >= 0; --byte) {
		size_t bucketsize[256] = {0};
		for (size_t i=0; i < N; ++i)
			++bucketsize[cache[i].chars[byte]];
		Cacheblock<CachedChars>* sorted = (Cacheblock<CachedChars>*)
			malloc(N*sizeof(Cacheblock<CachedChars>));
		size_t bucketindex[256];
		bucketindex[0] = 0;
		for (size_t i=1; i < 256; ++i)
			bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
		for (size_t i=0; i < N; ++i)
			memcpy(&sorted[bucketindex[cache[i].chars[byte]]++],
					cache+i,
					sizeof(Cacheblock<CachedChars>));
		memcpy(cache, sorted, N*sizeof(Cacheblock<CachedChars>));
		free(sorted);
	}
	size_t start=0, cnt=1;
	for (size_t i=0; i < N-1; ++i) {
		if (memcmp(cache[i].chars.data(), cache[i+1].chars.data(),
				CachedChars) == 0) {
			++cnt;
			continue;
		}
		if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
			msd_lsd(cache+start, cnt, depth+CachedChars);
		}
		cnt = 1;
		start = i+1;
	}
	if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
		msd_lsd(cache+start, cnt, depth+CachedChars);
	}
}